

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_accumulation.cc
# Opt level: O0

bool __thiscall sptk::MinMaxAccumulation::Run(MinMaxAccumulation *this,double data,Buffer *buffer)

{
  size_type sVar1;
  size_type sVar2;
  pointer ppVar3;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *this_00;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  pair<double,_int> new_pair;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_ffffffffffffff48;
  multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  bool local_1;
  
  if (((*(byte *)(in_RDI + 0xc) & 1) == 0) || (in_RSI == 0)) {
    local_1 = false;
  }
  else {
    std::make_pair<double&,int&>
              ((double *)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
    sVar1 = std::
            multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::size((multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    *)0x10862e);
    if (sVar1 < (ulong)(long)*(int *)(in_RDI + 8)) {
      std::multimap<double,int,std::greater<double>,std::allocator<std::pair<double_const,int>>>::
      insert<std::pair<double,int>const&>
                ((multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  *)in_stack_ffffffffffffff48,(pair<double,_int> *)0x108655);
    }
    else {
      std::
      multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>::
      begin((multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
             *)in_stack_ffffffffffffff48);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x10868e);
      if (in_XMM0_Qa < ppVar3->first) {
        in_stack_ffffffffffffff58._M_node = (_Base_ptr)(in_RSI + 0x10);
        std::
        multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
        ::begin((multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 *)in_stack_ffffffffffffff48);
        std::multimap<double,int,std::greater<double>,std::allocator<std::pair<double_const,int>>>::
        erase_abi_cxx11_(in_stack_ffffffffffffff50,(iterator)in_stack_ffffffffffffff58._M_node);
        std::multimap<double,int,std::greater<double>,std::allocator<std::pair<double_const,int>>>::
        insert<std::pair<double,int>const&>
                  ((multimap<double,_int,_std::greater<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    *)in_stack_ffffffffffffff48,(pair<double,_int> *)0x1086f2);
      }
    }
    sVar2 = std::
            multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::size((multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                    *)0x10870a);
    if (sVar2 < (ulong)(long)*(int *)(in_RDI + 8)) {
      std::multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>::
      insert<std::pair<double,int>const&>(in_stack_ffffffffffffff48,(pair<double,_int> *)0x108731);
    }
    else {
      std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
      ::begin(in_stack_ffffffffffffff48);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x10875b);
      if (ppVar3->first < in_XMM0_Qa) {
        this_00 = (multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   *)(in_RSI + 0x40);
        std::
        multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
        begin(in_stack_ffffffffffffff48);
        std::multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>::
        erase_abi_cxx11_(this_00,in_stack_ffffffffffffff58);
        std::multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>::
        insert<std::pair<double,int>const&>(in_stack_ffffffffffffff48,(pair<double,_int> *)0x1087c2)
        ;
      }
    }
    *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MinMaxAccumulation::Run(double data,
                             MinMaxAccumulation::Buffer* buffer) const {
  if (!is_valid_ || NULL == buffer) {
    return false;
  }

  const std::pair<double, int> new_pair(
      std::make_pair(data, buffer->position_));

  if (buffer->minimum_.size() < static_cast<std::size_t>(num_best_)) {
    buffer->minimum_.insert(new_pair);
  } else if (data < buffer->minimum_.begin()->first) {
    buffer->minimum_.erase(buffer->minimum_.begin());
    buffer->minimum_.insert(new_pair);
  }

  if (buffer->maximum_.size() < static_cast<std::size_t>(num_best_)) {
    buffer->maximum_.insert(new_pair);
  } else if (buffer->maximum_.begin()->first < data) {
    buffer->maximum_.erase(buffer->maximum_.begin());
    buffer->maximum_.insert(new_pair);
  }

  ++(buffer->position_);

  return true;
}